

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlGetObjectDictionaryNextItem
                    (JlDataObject *DictionaryObject,JlDataObject **pNextObject,char **pKeyName,
                    JlDictionaryItem **pEnumerator)

{
  undefined4 in_EAX;
  int iVar1;
  JL_STATUS JVar2;
  JlDictionaryItem *pJVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  
  auVar5._0_4_ = -(uint)(DictionaryObject == (JlDataObject *)0x0);
  auVar5._4_4_ = -(uint)(pNextObject == (JlDataObject **)0x0);
  auVar5._8_4_ = -(uint)(pKeyName == (char **)0x0);
  auVar5._12_4_ = -(uint)(pEnumerator == (JlDictionaryItem **)0x0);
  iVar1 = movmskps(in_EAX,auVar5);
  if (iVar1 != 0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  if (DictionaryObject->Type != JL_DATA_TYPE_DICTIONARY) {
    return JL_STATUS_WRONG_TYPE;
  }
  pJVar3 = *pEnumerator;
  if (pJVar3 == (JlDictionaryItem *)0x0) {
    pJVar3 = (DictionaryObject->field_2).Dictionary.DictionaryHead;
    *pEnumerator = pJVar3;
    if (pJVar3 == (JlDictionaryItem *)0x0) goto LAB_00101e18;
    *pNextObject = pJVar3->Object;
    pJVar3 = (DictionaryObject->field_2).Dictionary.DictionaryHead;
  }
  else {
    if (pJVar3->ParentDictionary != (JlDictionary *)&DictionaryObject->field_2) {
      return JL_STATUS_WRONG_TYPE;
    }
    pJVar3 = pJVar3->Next;
    *pEnumerator = pJVar3;
    if (pJVar3 == (JlDictionaryItem *)0x0) {
LAB_00101e18:
      *pNextObject = (JlDataObject *)0x0;
      JVar2 = JL_STATUS_END_OF_DATA;
      pcVar4 = (char *)0x0;
      goto LAB_00101e21;
    }
    *pNextObject = pJVar3->Object;
    pJVar3 = *pEnumerator;
  }
  pcVar4 = pJVar3->KeyName;
  JVar2 = JL_STATUS_SUCCESS;
LAB_00101e21:
  *pKeyName = pcVar4;
  return JVar2;
}

Assistant:

JL_STATUS
    JlGetObjectDictionaryNextItem
    (
        JlDataObject const*       DictionaryObject,
        JlDataObject**            pNextObject,
        char const**              pKeyName,
        JlDictionaryItem**        pEnumerator
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != pNextObject
        &&  NULL != pKeyName
        &&  NULL != pEnumerator )
    {
        if(     JL_DATA_TYPE_DICTIONARY == DictionaryObject->Type
            &&  ( NULL == *pEnumerator  || (*pEnumerator)->ParentDictionary == &DictionaryObject->Dictionary ) )
        {
            if( NULL == *pEnumerator )
            {
                // Get first item
                *pEnumerator = DictionaryObject->Dictionary.DictionaryHead;
                if( NULL != DictionaryObject->Dictionary.DictionaryHead )
                {
                    *pNextObject = DictionaryObject->Dictionary.DictionaryHead->Object;
                    *pKeyName    = DictionaryObject->Dictionary.DictionaryHead->KeyName;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    // Empty dictionary
                    *pNextObject = NULL;
                    *pKeyName = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
            else
            {
                // Move enumerator to next item.
                *pEnumerator = (*pEnumerator)->Next;
                if( NULL != *pEnumerator )
                {
                    *pNextObject = (*pEnumerator)->Object;
                    *pKeyName    = (*pEnumerator)->KeyName;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    *pNextObject = NULL;
                    *pKeyName    = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}